

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion * __thiscall AML::Quaternion::operator*=(Quaternion *this,Quaternion *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double q3_new;
  double q2_new;
  double q1_new;
  double q0_new;
  Quaternion *rhs_local;
  Quaternion *this_local;
  
  dVar1 = (rhs->field_0).data[0];
  dVar2 = (this->field_0).data[1];
  dVar3 = (rhs->field_0).data[1];
  dVar4 = (this->field_0).data[0];
  dVar5 = (rhs->field_0).data[2];
  dVar6 = (this->field_0).data[3];
  dVar7 = (rhs->field_0).data[3];
  dVar8 = (this->field_0).data[2];
  dVar9 = (rhs->field_0).data[0];
  dVar10 = (this->field_0).data[2];
  dVar11 = (rhs->field_0).data[1];
  dVar12 = (this->field_0).data[3];
  dVar13 = (rhs->field_0).data[2];
  dVar14 = (this->field_0).data[0];
  dVar15 = (rhs->field_0).data[3];
  dVar16 = (this->field_0).data[1];
  dVar17 = (rhs->field_0).data[0];
  dVar18 = (this->field_0).data[3];
  dVar19 = (rhs->field_0).data[1];
  dVar20 = (this->field_0).data[2];
  dVar21 = (rhs->field_0).data[2];
  dVar22 = (this->field_0).data[1];
  dVar23 = (rhs->field_0).data[3];
  dVar24 = (this->field_0).data[0];
  (this->field_0).data[0] =
       -(rhs->field_0).data[3] * (this->field_0).data[3] +
       -(rhs->field_0).data[2] * (this->field_0).data[2] +
       (rhs->field_0).data[0] * (this->field_0).data[0] +
       -((rhs->field_0).data[1] * (this->field_0).data[1]);
  (this->field_0).data[1] = dVar7 * dVar8 + -dVar5 * dVar6 + dVar1 * dVar2 + dVar3 * dVar4;
  (this->field_0).data[2] = -dVar15 * dVar16 + dVar13 * dVar14 + dVar9 * dVar10 + dVar11 * dVar12;
  (this->field_0).data[3] = dVar23 * dVar24 + dVar21 * dVar22 + dVar17 * dVar18 + -(dVar19 * dVar20)
  ;
  return this;
}

Assistant:

Quaternion& Quaternion::operator*=(const Quaternion& rhs)
    {
        double q0_new = (rhs.q0 * q0) - (rhs.q1 * q1) - (rhs.q2 * q2) - (rhs.q3 * q3);
        double q1_new = (rhs.q0 * q1) + (rhs.q1 * q0) - (rhs.q2 * q3) + (rhs.q3 * q2);
        double q2_new = (rhs.q0 * q2) + (rhs.q1 * q3) + (rhs.q2 * q0) - (rhs.q3 * q1);
        double q3_new = (rhs.q0 * q3) - (rhs.q1 * q2) + (rhs.q2 * q1) + (rhs.q3 * q0);
        q0 = q0_new;
        q1 = q1_new;
        q2 = q2_new;
        q3 = q3_new;
        return *this;
    }